

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Promise<void> kj::yield(void)

{
  PromiseBase in_RDI;
  
  if (yield()::NODE == '\0') {
    yield();
  }
  *(YieldPromiseNode **)in_RDI.node.ptr = &yield::NODE;
  return (Promise<void>)(PromiseNode *)in_RDI.node.ptr;
}

Assistant:

Promise<void> yield() {
  class YieldPromiseNode final: public _::PromiseNode {
  public:
    void destroy() override {}

    void onReady(_::Event* event) noexcept override {
      if (event) event->armBreadthFirst();
    }
    void get(_::ExceptionOrValue& output) noexcept override {
      output.as<_::Void>() = _::Void();
    }
    void tracePromise(_::TraceBuilder& builder, bool stopAtNextEvent) override {
      builder.add(reinterpret_cast<void*>(&kj::yield));
    }
  };

  static YieldPromiseNode NODE;
  return _::PromiseNode::to<Promise<void>>(_::OwnPromiseNode(&NODE));
}